

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall Omega_h::mark_image(Omega_h *this,LOs *a2b,LO nb)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  uint uVar3;
  size_t sVar4;
  Read<signed_char> RVar5;
  Write<signed_char> out;
  type f;
  Write<signed_char> WStack_a8;
  string local_98;
  Write<signed_char> local_78;
  Write<int> local_68;
  Write<signed_char> local_58;
  Write<int> local_48;
  Write<signed_char> local_38;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_98,"",(allocator *)&local_68);
  Write<signed_char>::Write(&WStack_a8,nb,'\0',&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  Write<int>::Write(&local_48,&a2b->write_);
  Write<signed_char>::Write(&local_38,&WStack_a8);
  Write<int>::Write(&local_68,&local_48);
  Write<signed_char>::Write(&local_58,&local_38);
  uVar3 = (uint)(sVar4 >> 2);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_98,&local_68);
    Write<signed_char>::Write((Write<signed_char> *)&local_98.field_2,&local_58);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(undefined1 *)
       (local_98.field_2._8_8_ + (long)*(int *)(local_98._M_string_length + uVar2 * 4)) = 1;
    }
    mark_image(Omega_h::Read<int>,int)::$_0::~__0((__0 *)&local_98);
  }
  mark_image(Omega_h::Read<int>,int)::$_0::~__0((__0 *)&local_68);
  Write<signed_char>::Write(&local_78,&WStack_a8);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_78);
  Write<signed_char>::~Write(&local_78);
  mark_image(Omega_h::Read<int>,int)::$_0::~__0((__0 *)&local_48);
  Write<signed_char>::~Write(&WStack_a8);
  RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_image(LOs a2b, LO nb) {
  auto na = a2b.size();
  Write<I8> out(nb, 0);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    out[b] = 1;
  };
  parallel_for(na, f, "mark_image");
  return out;
}